

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_pack_16_rr(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *r_dst;
  uint src;
  
  if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
  }
  else {
    uVar1 = m68ki_cpu.dar[m68ki_cpu.ir & 7];
    uVar2 = m68ki_read_imm_16();
    uVar3 = uVar1 + uVar2;
    m68ki_cpu.dar[m68ki_cpu.ir >> 9 & 7] =
         m68ki_cpu.dar[m68ki_cpu.ir >> 9 & 7] & 0xffffff00 | uVar3 >> 4 & 0xf0 | uVar3 & 0xf;
  }
  return;
}

Assistant:

static void m68k_op_pack_16_rr(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		/* Note: DX and DY are reversed in Motorola's docs */
		uint src = DY + OPER_I_16();
		uint* r_dst = &DX;

		*r_dst = MASK_OUT_BELOW_8(*r_dst) | ((src >> 4) & 0x00f0) | (src & 0x000f);
		return;
	}
	m68ki_exception_illegal();
}